

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Reals __thiscall Omega_h::interpolate_between(Omega_h *this,Reals *a,Reals *b,Real t)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar7;
  IntIterator last;
  int size_in;
  size_t sVar8;
  Reals RVar9;
  Write<double> out;
  type f;
  Write<double> local_f8;
  Write<double> local_e0;
  undefined1 local_d0 [32];
  Real local_b0;
  Alloc *local_a8;
  void *local_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  void *pvStack_80;
  Real local_78;
  Alloc *local_70;
  void *pvStack_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  void *local_48;
  Real local_40;
  Alloc *local_38;
  void *local_30;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    uVar5 = pAVar3->size;
  }
  else {
    uVar5 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar4 >> 3) == (int)(uVar5 >> 3)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar8 = pAVar2->size;
    }
    else {
      sVar8 = (ulong)pAVar2 >> 3;
    }
    local_d0._0_8_ = (Alloc *)(local_d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"");
    size_in = (int)(sVar8 >> 3);
    Write<double>::Write(&local_f8,size_in,(string *)local_d0);
    if ((Alloc *)local_d0._0_8_ != (Alloc *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
    }
    local_60 = local_f8.shared_alloc_.alloc;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60 = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58 = local_f8.shared_alloc_.direct_ptr;
    local_50 = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_48 = (a->write_).shared_alloc_.direct_ptr;
    local_38 = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38 = (Alloc *)(local_38->size * 8 + 1);
      }
      else {
        local_38->use_count = local_38->use_count + 1;
      }
    }
    local_30 = (b->write_).shared_alloc_.direct_ptr;
    local_98 = local_60;
    if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_98 = (Alloc *)(local_60->size * 8 + 1);
      }
      else {
        local_60->use_count = local_60->use_count + 1;
      }
    }
    pvStack_90 = local_f8.shared_alloc_.direct_ptr;
    local_88 = local_50;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88 = (Alloc *)(local_50->size * 8 + 1);
      }
      else {
        local_50->use_count = local_50->use_count + 1;
      }
    }
    local_70 = local_38;
    if (((ulong)local_38 & 7) == 0 && local_38 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_70 = (Alloc *)(local_38->size * 8 + 1);
      }
      else {
        local_38->use_count = local_38->use_count + 1;
      }
    }
    pvStack_80 = local_48;
    local_78 = t;
    pvStack_68 = local_30;
    local_40 = t;
    if (0 < size_in) {
      local_d0._8_8_ = local_f8.shared_alloc_.direct_ptr;
      local_d0._0_8_ = local_98;
      if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
        local_98->use_count = local_98->use_count + -1;
        local_d0._0_8_ = local_98->size * 8 + 1;
      }
      local_98 = (Alloc *)0x0;
      pvStack_90 = (void *)0x0;
      local_d0._16_8_ = local_88;
      if (((ulong)local_88 & 7) == 0 && local_88 != (Alloc *)0x0) {
        local_88->use_count = local_88->use_count + -1;
        local_d0._16_8_ = local_88->size * 8 + 1;
      }
      local_88 = (Alloc *)0x0;
      pvStack_80 = (void *)0x0;
      local_a8 = local_70;
      if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
        local_70->use_count = local_70->use_count + -1;
        local_a8 = (Alloc *)(local_70->size * 8 + 1);
      }
      local_70 = (Alloc *)0x0;
      pvStack_68 = (void *)0x0;
      entering_parallel = '\0';
      lVar6 = 0;
      do {
        *(double *)((long)local_f8.shared_alloc_.direct_ptr + lVar6 * 8) =
             *(double *)((long)local_48 + lVar6 * 8) * (1.0 - t) +
             *(double *)((long)local_30 + lVar6 * 8) * t;
        lVar6 = lVar6 + 1;
      } while (size_in != (int)lVar6);
      local_d0._24_8_ = local_48;
      local_b0 = t;
      local_a0 = local_30;
      interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
                ((__0 *)local_d0);
    }
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_98);
    local_e0.shared_alloc_.alloc = local_f8.shared_alloc_.alloc;
    local_e0.shared_alloc_.direct_ptr = local_f8.shared_alloc_.direct_ptr;
    if ((((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
         local_f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_f8.shared_alloc_.alloc)->use_count = (local_f8.shared_alloc_.alloc)->use_count + -1;
      local_e0.shared_alloc_.alloc = (Alloc *)((local_f8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_f8.shared_alloc_.alloc = (Alloc *)0x0;
    local_f8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_e0);
    pAVar2 = local_e0.shared_alloc_.alloc;
    if (((ulong)local_e0.shared_alloc_.alloc & 7) == 0 &&
        local_e0.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e0.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e0.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    interpolate_between(Omega_h::Read<double>,Omega_h::Read<double>,double)::$_0::~__0
              ((__0 *)&local_60);
    pAVar2 = local_f8.shared_alloc_.alloc;
    pvVar7 = extraout_RDX;
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_f8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_f8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar7 = extraout_RDX_00;
      }
    }
    RVar9.write_.shared_alloc_.direct_ptr = pvVar7;
    RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x238);
}

Assistant:

Reals interpolate_between(Reals a, Reals b, Real t) {
  OMEGA_H_CHECK(a.size() == b.size());
  auto n = a.size();
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = a[i] * (1.0 - t) + b[i] * t; };
  parallel_for(n, f, "interpolate_between");
  return out;
}